

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

_Bool is_resolveable_host(char *str)

{
  int iVar1;
  long in_FS_OFFSET;
  int ret;
  char *str_local;
  addrinfo *local_48;
  addrinfo *result;
  addrinfo hints;
  
  hints.ai_next = *(addrinfo **)(in_FS_OFFSET + 0x28);
  local_48 = (addrinfo *)0x0;
  memset(&result,0,0x30);
  result._4_4_ = 0;
  hints.ai_flags = 1;
  result._0_4_ = 0;
  hints.ai_family = 0;
  iVar1 = getaddrinfo(str,(char *)0x0,(addrinfo *)&result,&local_48);
  freeaddrinfo(local_48);
  if (*(addrinfo **)(in_FS_OFFSET + 0x28) == hints.ai_next) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

static bool is_resolveable_host(const char *str)
{
	struct addrinfo hints;
	struct addrinfo *result = NULL;

	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = 0;
	hints.ai_protocol = 0;

	int ret = getaddrinfo(str, NULL, &hints, &result);

	freeaddrinfo(result);

	if (ret != 0)
		return false;
	return true;
}